

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O2

void png_set_user_transform_info
               (png_structrp png_ptr,png_voidp user_transform_ptr,int user_transform_depth,
               int user_transform_channels)

{
  if (png_ptr != (png_structrp)0x0) {
    if (((png_ptr->mode & 0x8000) != 0) && ((png_ptr->flags & 0x40) != 0)) {
      png_app_error(png_ptr,"info change after png_start_read_image or png_read_update_info");
      return;
    }
    png_ptr->user_transform_ptr = user_transform_ptr;
    png_ptr->user_transform_depth = (png_byte)user_transform_depth;
    png_ptr->user_transform_channels = (png_byte)user_transform_channels;
  }
  return;
}

Assistant:

void PNGAPI
png_set_user_transform_info(png_structrp png_ptr, png_voidp
   user_transform_ptr, int user_transform_depth, int user_transform_channels)
{
   png_debug(1, "in png_set_user_transform_info");

   if (png_ptr == NULL)
      return;

#ifdef PNG_READ_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->mode & PNG_IS_READ_STRUCT) != 0 &&
      (png_ptr->flags & PNG_FLAG_ROW_INIT) != 0)
   {
      png_app_error(png_ptr,
          "info change after png_start_read_image or png_read_update_info");
      return;
   }
#endif

   png_ptr->user_transform_ptr = user_transform_ptr;
   png_ptr->user_transform_depth = (png_byte)user_transform_depth;
   png_ptr->user_transform_channels = (png_byte)user_transform_channels;
}